

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O3

void __thiscall ON_UuidList::PurgeHelper(ON_UuidList *this)

{
  uchar *puVar1;
  int iVar2;
  ON_UUID_struct *pOVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  int i;
  long lVar8;
  long lVar9;
  
  if ((0 < this->m_removed_count) &&
     (this->m_removed_count <= (this->super_ON_SimpleArray<ON_UUID_struct>).m_count)) {
    this->m_removed_count = 0;
    lVar9 = 0;
    lVar8 = 0;
    iVar7 = 0;
    do {
      bVar6 = ::operator==(&ON_max_uuid,
                           (ON_UUID_struct *)
                           (((this->super_ON_SimpleArray<ON_UUID_struct>).m_a)->Data4 + lVar9 + -8))
      ;
      if (!bVar6) {
        if (iVar7 < lVar8) {
          pOVar3 = (this->super_ON_SimpleArray<ON_UUID_struct>).m_a;
          puVar1 = pOVar3->Data4 + lVar9 + -8;
          uVar4 = *(undefined8 *)puVar1;
          uVar5 = *(undefined8 *)(puVar1 + 8);
          pOVar3 = pOVar3 + iVar7;
          pOVar3->Data1 = (int)uVar4;
          pOVar3->Data2 = (short)((ulong)uVar4 >> 0x20);
          pOVar3->Data3 = (short)((ulong)uVar4 >> 0x30);
          *(undefined8 *)pOVar3->Data4 = uVar5;
        }
        iVar7 = iVar7 + 1;
      }
      lVar8 = lVar8 + 1;
      iVar2 = (this->super_ON_SimpleArray<ON_UUID_struct>).m_count;
      lVar9 = lVar9 + 0x10;
    } while (lVar8 < iVar2);
    if (iVar7 < iVar2) {
      (this->super_ON_SimpleArray<ON_UUID_struct>).m_count = iVar7;
      if (iVar7 < 1) {
        this->m_sorted_count = 0;
      }
      else {
        this->m_sorted_count = 1;
        if (iVar7 != 1) {
          iVar7 = 1;
          do {
            pOVar3 = (this->super_ON_SimpleArray<ON_UUID_struct>).m_a;
            iVar7 = ON_UuidCompare(pOVar3 + (long)iVar7 + -1,pOVar3 + iVar7);
            if (0 < iVar7) {
              return;
            }
            iVar7 = this->m_sorted_count + 1;
            this->m_sorted_count = iVar7;
          } while (iVar7 < (this->super_ON_SimpleArray<ON_UUID_struct>).m_count);
        }
      }
    }
  }
  return;
}

Assistant:

void ON_UuidList::PurgeHelper()
{
  if ( m_removed_count <= m_count && m_removed_count > 0 )
  {
    m_removed_count = 0;

    // purge removed ids
    int count = 0;
    for ( int i = 0; i < m_count; i++ )
    {
      if ( ON_max_uuid == m_a[i] )
        continue;

      if ( i > count )
        m_a[count] = m_a[i];

      count++;
    }

    if ( count < m_count )
    {
      m_count = count;
      if ( count > 0 )
      {
        // set m_sorted_count
        for ( m_sorted_count = 1; m_sorted_count < m_count; m_sorted_count++ )
        {
          if ( ON_UuidCompare(m_a[m_sorted_count-1],m_a[m_sorted_count])> 0 )
            break;
        }
      }
      else
      {
        m_sorted_count = 0;
      }
    }
  }
}